

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

bool __thiscall llvm::detail::IEEEFloat::bitwiseIsEqual(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Significand *__s2;
  Significand *__s1;
  byte bVar4;
  
  if (this == rhs) {
    return true;
  }
  if (this->semantics == rhs->semantics) {
    bVar1 = this->field_0x12;
    bVar4 = bVar1 & 7;
    if ((bVar4 == (rhs->field_0x12 & 7)) && (((rhs->field_0x12 ^ bVar1) & 8) == 0)) {
      if ((bVar1 & 7) == 0) {
        return true;
      }
      if (bVar4 == 3) {
        return true;
      }
      if ((bVar4 == 3 || (bVar1 & 6) == 0) || (this->exponent == rhs->exponent)) {
        uVar2 = this->semantics->precision;
        if (0x3fffffe < uVar2 >> 6) {
          return true;
        }
        if (uVar2 - 0x40 < 0xffffff80) {
          __s1 = (Significand *)(this->significand).parts;
        }
        else {
          __s1 = &this->significand;
        }
        if (rhs->semantics->precision - 0x40 < 0xffffff80) {
          __s2 = (Significand *)(rhs->significand).parts;
        }
        else {
          __s2 = &rhs->significand;
        }
        iVar3 = bcmp(__s1,__s2,(ulong)(uVar2 + 0x40 >> 3 & 0xfffffff8));
        return iVar3 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool IEEEFloat::bitwiseIsEqual(const IEEEFloat &rhs) const {
  if (this == &rhs)
    return true;
  if (semantics != rhs.semantics ||
      category != rhs.category ||
      sign != rhs.sign)
    return false;
  if (category==fcZero || category==fcInfinity)
    return true;

  if (isFiniteNonZero() && exponent != rhs.exponent)
    return false;

  return std::equal(significandParts(), significandParts() + partCount(),
                    rhs.significandParts());
}